

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_shape
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,uint8_t info,
          error_code *ec)

{
  bool bVar1;
  char_result<unsigned_char> cVar2;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *pbVar3;
  error_code *in_RDX;
  char in_SIL;
  value_type_conflict3 *in_RDI;
  size_t dim_1;
  size_t i;
  size_t size;
  size_t dim;
  char_result<unsigned_char> c;
  error_code *in_stack_ffffffffffffffc0;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this_00;
  uchar local_1a;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2aec2b);
  if (in_SIL == '\x1f') {
    while (cVar2 = bytes_source::peek((bytes_source *)(in_RDI + 6)), ((ushort)cVar2 & 0x100) == 0) {
      local_1a = cVar2.value;
      if (local_1a == 0xff) {
        bytes_source::ignore((bytes_source *)(in_RDI + 6),1);
      }
      else {
        get_size(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar1) {
          return;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffffc0,in_RDI);
      }
    }
    std::error_code::operator=(in_stack_ffffffffffffffc0,(cbor_errc)((ulong)in_RDI >> 0x20));
    *(undefined1 *)(in_RDI + 1) = 0;
  }
  else {
    pbVar3 = (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)
             get_size(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
    if (!bVar1) {
      for (this_00 = (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)0x0;
          (in_RDI[1] & 1) != 0 && this_00 < pbVar3;
          this_00 = (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)
                    ((long)&(this_00->super_ser_context)._vptr_ser_context + 1)) {
        in_stack_ffffffffffffffc0 = (error_code *)get_size(this_00,in_stack_ffffffffffffffc0);
        bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar1) {
          return;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffffc0,in_RDI);
      }
    }
  }
  return;
}

Assistant:

void read_shape(uint8_t info, std::error_code& ec)
    {
        shape_.clear();
        switch (info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                while (true)
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                    }
                    else
                    {
                        std::size_t dim = get_size(ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        shape_.push_back(dim);
                    }
                }
                break;
            }
            default:
            {
                std::size_t size = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                for (std::size_t i = 0; more_ && i < size; ++i)
                {
                    std::size_t dim = get_size(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    shape_.push_back(dim);
                }
                break;
            }
        }
    }